

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O3

void Omega_h::unite_with<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(b->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)a,
               (int *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void unite_with(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) a.insert(x);
}